

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  value_type *ppIVar1;
  int local_14;
  int i;
  ImFontAtlas *this_local;
  
  for (local_14 = 0; local_14 < (this->Fonts).Size; local_14 = local_14 + 1) {
    ppIVar1 = ImVector<ImFont_*>::operator[](&this->Fonts,local_14);
    ImFont::~ImFont(*ppIVar1);
    ppIVar1 = ImVector<ImFont_*>::operator[](&this->Fonts,local_14);
    ImGui::MemFree(*ppIVar1);
  }
  ImVector<ImFont_*>::clear(&this->Fonts);
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    for (int i = 0; i < Fonts.Size; i++)
    {
        Fonts[i]->~ImFont();
        ImGui::MemFree(Fonts[i]);
    }
    Fonts.clear();
}